

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtok.c
# Opt level: O0

ssize_t mpt_memtok(iovec *data,size_t ndat,char *tok,char *com,char *escape)

{
  char cVar1;
  int *piVar2;
  void *pvVar3;
  ushort **ppuVar4;
  ulong uVar5;
  size_t sVar6;
  bool bVar7;
  size_t local_90;
  size_t local_88;
  size_t local_80;
  uint local_78;
  int prev;
  int match;
  size_t elen;
  size_t clen;
  size_t tlen;
  size_t pos;
  size_t len;
  size_t i;
  uchar *curr;
  char *escape_local;
  char *com_local;
  char *tok_local;
  size_t ndat_local;
  iovec *data_local;
  
  i = 0;
  len = 0;
  pos = 0;
  tlen = 0;
  cVar1 = '\0';
  local_78 = 0x20;
  if (data == (iovec *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0xe;
    data_local = (iovec *)0xffffffffffffffff;
  }
  else {
    if (tok == (char *)0x0) {
      local_80 = 0;
    }
    else {
      local_80 = strlen(tok);
    }
    if (com == (char *)0x0) {
      local_88 = 0;
    }
    else {
      local_88 = strlen(com);
    }
    if (escape == (char *)0x0) {
      local_90 = 0;
    }
    else {
      local_90 = strlen(escape);
    }
LAB_0011d687:
    tlen = tlen + 1;
    if (tlen < pos) goto LAB_0011d705;
    if (len < ndat) goto LAB_0011d6bb;
    piVar2 = __errno_location();
    *piVar2 = 0xb;
    data_local = (iovec *)0xfffffffffffffffe;
  }
  return (ssize_t)data_local;
LAB_0011d6bb:
  tlen = 0;
  i = (size_t)data[len].iov_base;
  sVar6 = len + 1;
  pos = data[len].iov_len;
  len = sVar6;
  if (pos == 0) goto LAB_0011d687;
LAB_0011d705:
  if (local_90 != 0) {
    if (cVar1 != '\0') {
      if ((*(char *)i == cVar1) && (local_78 != 0x5c)) {
        cVar1 = '\0';
      }
      local_78 = (uint)*(byte *)i;
      i = i + 1;
      goto LAB_0011d687;
    }
    pvVar3 = memchr(escape,(uint)*(byte *)i,local_90);
    if (pvVar3 != (void *)0x0) {
      cVar1 = *(char *)i;
      i = i + 1;
      goto LAB_0011d687;
    }
  }
  if (((local_88 != 0) && (pvVar3 = memchr(com,(uint)*(byte *)i,local_88), pvVar3 != (void *)0x0))
     && (ppuVar4 = __ctype_b_loc(), ((*ppuVar4)[(int)local_78] & 0x2000) != 0)) {
    if (tok != (char *)0x0) goto LAB_0011d906;
    while( true ) {
      do {
        uVar5 = tlen + 1;
        bVar7 = false;
        if (tlen < pos) {
          bVar7 = *(char *)(i + 1) != '\n';
          i = i + 1;
        }
        tlen = uVar5;
      } while (bVar7);
      if (uVar5 <= pos) break;
      if (ndat <= len) {
        piVar2 = __errno_location();
        *piVar2 = 0xb;
        return -2;
      }
      tlen = 0;
      i = (size_t)data[len].iov_base;
      pos = data[len].iov_len;
      len = len + 1;
    }
  }
  if (tok == (char *)0x0) {
    ppuVar4 = __ctype_b_loc();
    if (((*ppuVar4)[(int)(uint)*(byte *)i] & 0x2000) == 0) goto LAB_0011d906;
  }
  else if ((local_80 != 0) &&
          (pvVar3 = memchr(tok,(uint)*(byte *)i,local_80), pvVar3 != (void *)0x0)) {
LAB_0011d906:
    if (cVar1 != '\0') {
      piVar2 = __errno_location();
      *piVar2 = 0xb;
      return -2;
    }
    _prev = 0;
    while( true ) {
      if (len - 1 <= _prev) {
        return tlen;
      }
      tlen = data[_prev].iov_len + tlen;
      if (0x7fffffffffffffff < tlen) break;
      _prev = _prev + 1;
    }
    piVar2 = __errno_location();
    *piVar2 = 0x4b;
    return -1;
  }
  local_78 = (uint)*(byte *)i;
  i = i + 1;
  goto LAB_0011d687;
}

Assistant:

extern ssize_t mpt_memtok(const struct iovec *data, size_t ndat, const char *tok, const char *com, const char *escape)
{
	unsigned char	*curr = NULL;
	size_t	i = 0, len = 0, pos = 0, tlen, clen, elen;
	int	match = 0, prev = ' ';
	
	if ( data == NULL ) {
		errno = EFAULT; return -1;
	}
	
	tlen = tok ? strlen(tok) : 0;
	clen = com ? strlen(com) : 0;
	elen = escape ? strlen(escape) : 0;
	
	while ( 1 ) {
		/* continue in next data part */
		if ( ++pos >= len ) {
			if ( i >= ndat ) {
				errno = EAGAIN; return -2;
			}
			pos  = 0;
			curr = data[i].iov_base;
			if ( !(len = data[i++].iov_len ) )
				continue;
		}
		/* check for escape character */
		if ( elen ) {
			if ( match ) {
				/* unset if current is valid end */
				if ( *curr == match && prev != '\\' )
					match = 0;
				prev = *(curr++);
				continue;
			}
			/* mark if current is in delimiters */
			else if ( memchr(escape, *curr, elen) ) {
				match = *(curr++);
				continue;
			}
		}
		/* charater is in comments */
		if ( clen && memchr(com, *curr, clen) && isspace(prev) ) {
			if ( tok )
				break;
			/* continue until end of line */
			do {
				while ( pos++ < len && *(++curr) != '\n' );
				
				if ( pos <= len )
					break;
				else if ( i >= ndat ) {
					errno = EAGAIN; return -2;
				}
				pos  = 0;
				curr = data[i].iov_base;
				len  = data[i++].iov_len;
				
			} while ( 1 );
		}
		/* token is found */
		if ( tok ) {
			if ( tlen && memchr(tok, *curr, tlen) )
				break;
		}
		/* finding visible character succeeded */
		else if ( !isspace(*curr) )
			break;
		
		prev = *(curr++);
	}
	
	i--;
	
	/* escaped sequence unfinished */
	if ( match ) {
		errno = EAGAIN; return -2;
	}
	for ( elen = 0 ; elen < i ; elen ++ ) {
		/* offset is to big for return value */
		if ( (pos += data[elen].iov_len) > SSIZE_MAX ) {
			errno = EOVERFLOW; return -1;
		}
	}
	
	return pos;
}